

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiWindow *ref_window;
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  int iVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  
  pIVar1 = GImGui;
  if (under_this_window == (ImGuiWindow *)0x0) {
    uVar4 = (GImGui->WindowsFocusOrder).Size;
    goto LAB_0010e33a;
  }
  iVar3 = -1;
  for (; (under_this_window->Flags & 0x1000000) != 0;
      under_this_window = under_this_window->ParentWindow) {
    iVar3 = 0;
  }
  uVar4 = iVar3 + under_this_window->FocusOrder;
  while( true ) {
    if ((int)uVar4 < 0) {
      FocusWindow((ImGuiWindow *)0x0);
      return;
    }
    pIVar5 = (GImGui->WindowsFocusOrder).Data[uVar4];
    if (((pIVar5 != ignore_window) && (pIVar5->WasActive == true)) &&
       ((~pIVar5->Flags & 0x40200U) != 0)) break;
LAB_0010e33a:
    uVar4 = uVar4 - 1;
  }
  ref_window = pIVar5->NavLastChildNavWindow;
  if ((ref_window != (ImGuiWindow *)0x0) && (ref_window->WasActive != false)) {
    if (GImGui->NavWindow != ref_window) {
      GImGui->NavWindow = ref_window;
      if (ref_window == (ImGuiWindow *)0x0) {
        IVar2 = 0;
      }
      else {
        if (pIVar1->NavDisableMouseHover == true) {
          pIVar1->NavMousePosDirty = true;
        }
        IVar2 = ref_window->NavLastIds[0];
      }
      pIVar1->NavId = IVar2;
      pIVar1->NavFocusScopeId = 0;
      pIVar1->NavIdIsAlive = false;
      pIVar1->NavLayer = ImGuiNavLayer_Main;
      pIVar1->NavMoveSubmitted = false;
      pIVar1->NavMoveScoringItems = false;
      pIVar1->NavAnyRequest = false;
      pIVar1->NavInitRequest = false;
    }
    pIVar5 = (ImGuiWindow *)0x0;
    ClosePopupsOverWindow(ref_window,false);
    if (ref_window != (ImGuiWindow *)0x0) {
      pIVar5 = ref_window->RootWindow;
    }
    if (((pIVar1->ActiveId != 0) && (pIVar1->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       ((pIVar1->ActiveIdWindow->RootWindow != pIVar5 &&
        (pIVar1->ActiveIdNoClearOnFocusLoss == false)))) {
      ClearActiveID();
    }
    if (ref_window != (ImGuiWindow *)0x0) {
      BringWindowToFocusFront(pIVar5);
      if (((uint)(pIVar5->Flags | ref_window->Flags) >> 0xd & 1) == 0) {
        BringWindowToDisplayFront(pIVar5);
        return;
      }
    }
    return;
  }
  FocusWindow(pIVar5);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        // Aim at root window behind us, if we are in a child window that's our own root (see #4640)
        int offset = -1;
        while (under_this_window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            under_this_window = under_this_window->ParentWindow;
            offset = 0;
        }
        start_idx = FindWindowFocusIndex(under_this_window) + offset;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        IM_ASSERT(window == window->RootWindow);
        if (window != ignore_window && window->WasActive)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}